

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

bool __thiscall
Qentem::Value<char>::SetCharAndLength<unsigned_int>(Value<char> *this,char **key,uint *length)

{
  ValueType VVar1;
  SizeT SVar2;
  char *pcVar3;
  uint *length_local;
  char **key_local;
  Value<char> *this_local;
  
  VVar1 = Type(this);
  switch(VVar1) {
  case ValuePtr:
    this_local._7_1_ = SetCharAndLength<unsigned_int>((this->field_0).array_.storage_,key,length);
    break;
  default:
    this_local._7_1_ = false;
    break;
  case String:
    pcVar3 = String<char>::First((String<char> *)this);
    *key = pcVar3;
    SVar2 = String<char>::Length((String<char> *)this);
    *length = SVar2;
    this_local._7_1_ = true;
    break;
  case True:
    *key = "true";
    *length = 4;
    this_local._7_1_ = true;
    break;
  case False:
    *key = "false";
    *length = 5;
    this_local._7_1_ = true;
    break;
  case Null:
    *key = "null";
    *length = 4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SetCharAndLength(const Char_T *&key, Number_T &length) const noexcept {
        switch (Type()) {
            case ValueType::String: {
                key    = string_.First();
                length = Number_T{string_.Length()};
                return true;
            }

            case ValueType::True: {
                key    = JSONotation::TrueString;
                length = JSONotation::TrueStringLength;
                return true;
            }

            case ValueType::False: {
                key    = JSONotation::FalseString;
                length = JSONotation::FalseStringLength;
                return true;
            }

            case ValueType::Null: {
                key    = JSONotation::NullString;
                length = JSONotation::NullStringLength;
                return true;
            }

            case ValueType::ValuePtr: {
                return value_->SetCharAndLength(key, length);
            }

            default: {
                return false;
            }
        }
    }